

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

string * __thiscall S2CellId::ToToken_abi_cxx11_(string *__return_storage_ptr__,S2CellId *this)

{
  ulong uVar1;
  uint uVar2;
  string *result;
  long lVar3;
  ulong uVar4;
  
  uVar4 = this->id_;
  if (uVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"X","");
  }
  else {
    uVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    uVar4 = uVar4 >> ((byte)uVar1 & 0x3c);
    lVar3 = 0x10 - (uVar1 >> 2 & 0x3fffffff);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)lVar3);
    do {
      uVar2 = (uint)uVar4;
      uVar4 = uVar4 >> 4;
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar3 + -1] = "0123456789abcdef"[uVar2 & 0xf];
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

string S2CellId::ToToken() const {
  // Simple implementation: print the id in hex without trailing zeros.
  // Using hex has the advantage that the tokens are case-insensitive, all
  // characters are alphanumeric, no characters require any special escaping
  // in queries for most indexing systems, and it's easy to compare cell
  // tokens against the feature ids of the corresponding features.
  //
  // Using base 64 would produce slightly shorter tokens, but for typical cell
  // sizes used during indexing (up to level 15 or so) the average savings
  // would be less than 2 bytes per cell which doesn't seem worth it.

  // "0" with trailing 0s stripped is the empty string, which is not a
  // reasonable token.  Encode as "X".
  if (id_ == 0) return "X";
  const size_t num_zero_digits = Bits::FindLSBSetNonZero64(id_) / 4;
  return HexFormatString(id_ >> (4 * num_zero_digits), 16 - num_zero_digits);
}